

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall helics::helicsCLI11App::add_config_validation(helicsCLI11App *this)

{
  Option *pOVar1;
  App *in_RDI;
  Option *opt;
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string *Validator_description;
  Option *Validator;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined1 local_91 [9];
  string *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  Option *local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  pOVar1 = CLI::App::get_option((App *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  if (pOVar1 != (Option *)0x0) {
    local_10 = pOVar1;
    CLI::App::validate_positionals(in_RDI,true);
    Validator = local_10;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<helics::helicsCLI11App::add_config_validation()::_lambda(std::__cxx11::string_const&)_1_,void>
              (in_stack_ffffffffffffff20,(anon_class_1_0_00000001 *)local_10);
    pOVar1 = (Option *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    Validator_description = (string *)&stack0xffffffffffffff47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    CLI::Option::check(pOVar1,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                               *)Validator,Validator_description,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Validator_description);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Validator_description);
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    CLI::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1fe54a);
  }
  return;
}

Assistant:

void add_config_validation()
    {
        auto* opt = get_option("--config");
        if (opt != nullptr) {
            validate_positionals();
            opt->check([](const std::string& fname) {
                static const std::set<std::string> validExt = {
                    ".ini", ".toml", ".json", ".INI", ".JSON", ".TOML"};
                auto ext = std::filesystem::path(fname).extension().string();
                if (validExt.find(ext) == validExt.end()) {
                    return fname + " does not have a valid extension";
                }
                return std::string{};
            });
        }
    }